

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

wchar_t rd_history(void)

{
  char *pcVar1;
  char local_e8 [8];
  char text [80];
  char name [80];
  wchar_t local_3c;
  artifact *paStack_38;
  wchar_t aidx;
  artifact *art;
  short local_28;
  short local_26;
  wchar_t wStack_24;
  bitflag type [2];
  int16_t clev;
  int16_t dlev;
  int32_t turnno;
  size_t j;
  size_t i;
  uint32_t tmp32u;
  
  history_clear(player);
  rd_byte(&hist_size);
  if (hist_size < 3) {
    rd_u32b((uint32_t *)&i);
    for (j = 0; j < (uint)i; j = j + 1) {
      paStack_38 = (artifact *)0x0;
      local_3c = L'\0';
      for (_clev = 0; _clev < hist_size; _clev = _clev + 1) {
        rd_byte((uint8_t *)((long)&art + _clev + 6));
      }
      rd_s32b(&stack0xffffffffffffffdc);
      rd_s16b(&local_26);
      rd_s16b(&local_28);
      rd_string(text + 0x48,0x50);
      if ((text[0x48] != '\0') &&
         (paStack_38 = lookup_artifact_name(text + 0x48), paStack_38 != (artifact *)0x0)) {
        local_3c = paStack_38->aidx;
      }
      rd_string(local_e8,0x50);
      if ((text[0x48] == '\0') || (paStack_38 != (artifact *)0x0)) {
        history_add_full(player,(bitflag *)((long)&art + 6),local_3c,(int)local_26,(int)local_28,
                         wStack_24,local_e8);
      }
      else {
        pcVar1 = format("Couldn\'t find artifact %s!",text + 0x48);
        note(pcVar1);
      }
    }
    i._4_4_ = L'\0';
  }
  else {
    pcVar1 = format("Too many (%u) history types!",(ulong)hist_size);
    note(pcVar1);
    i._4_4_ = L'\xffffffff';
  }
  return i._4_4_;
}

Assistant:

int rd_history(void)
{
	uint32_t tmp32u;
	size_t i, j;
	
	history_clear(player);

	/* History type flags */
	rd_byte(&hist_size);
	if (hist_size > HIST_SIZE) {
	        note(format("Too many (%u) history types!", hist_size));
		return (-1);
	}

	rd_u32b(&tmp32u);
	for (i = 0; i < tmp32u; i++) {
		int32_t turnno;
		int16_t dlev, clev;
		bitflag type[HIST_SIZE];
		const struct artifact *art = NULL;
		int aidx = 0;
		char name[80];
		char text[80];

		for (j = 0; j < hist_size; j++)		
			rd_byte(&type[j]);
		rd_s32b(&turnno);
		rd_s16b(&dlev);
		rd_s16b(&clev);
		rd_string(name, sizeof(name));
		if (name[0]) {
			art = lookup_artifact_name(name);
			if (art) {
				aidx = art->aidx;
			}
		}
		rd_string(text, sizeof(text));
		if (name[0] && !art) {
			note(format("Couldn't find artifact %s!", name));
			continue;
		}

		history_add_full(player, type, aidx, dlev, clev, turnno, text);
	}

	return 0;
}